

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexFinder.cpp
# Opt level: O2

SelectionSet * __thiscall
OpenMD::IndexFinder::find(SelectionSet *__return_storage_ptr__,IndexFinder *this,int molIndex)

{
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::vector
            (&__return_storage_ptr__->bitsets_,
             &(this->selectionSets_).
              super__Vector_base<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>.
              _M_impl.super__Vector_impl_data._M_start[molIndex].bitsets_);
  return __return_storage_ptr__;
}

Assistant:

SelectionSet IndexFinder::find(int molIndex) {
#ifdef IS_MPI
    int proc;
    int worldRank;
    MPI_Comm_rank(MPI_COMM_WORLD, &worldRank);
    proc = info_->getMolToProc(molIndex);

    if (proc == worldRank) {
#endif
      return selectionSets_[molIndex];
#ifdef IS_MPI
    } else {
      return SelectionSet(nObjects_);
    }
#endif
  }